

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugNodeWindow(ImGuiWindow *window,char *label)

{
  uint uVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  byte bVar4;
  bool bVar5;
  char *label_00;
  char *pcVar6;
  ImVec2 *unaff_RBX;
  char *windows;
  ImGuiWindow *in_RSI;
  ImGuiWindow *in_RDI;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *columns;
  char *pcVar10;
  ImDrawList *unaff_R14;
  char *label_01;
  bool bVar11;
  int n;
  ImRect r;
  int layer;
  ImGuiWindowFlags flags;
  bool open;
  ImGuiTreeNodeFlags tree_node_flags;
  bool is_active;
  ImGuiContext *g;
  char *in_stack_00000260;
  ImDrawList *in_stack_00000268;
  ImGuiWindow *in_stack_00000270;
  ImVec2 *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  int count;
  ImGuiHoveredFlags in_stack_ffffffffffffff60;
  ImVec4 *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  ImGuiCol idx;
  ImGuiStorage *storage;
  uint local_80;
  int local_60;
  float target_id;
  float fStack_58;
  float local_54;
  float fStack_50;
  uint local_4c;
  ImGuiContext *label_02;
  
  count = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  idx = (ImGuiCol)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  if (in_RDI == (ImGuiWindow *)0x0) {
    BulletText("%s: NULL",in_RSI);
  }
  else {
    bVar4 = in_RDI->WasActive & 1;
    bVar11 = in_RDI == GImGui->NavWindow;
    label_02 = GImGui;
    if (bVar4 == 0) {
      GetStyleColorVec4(1);
      PushStyleColor(idx,in_stack_ffffffffffffff68);
    }
    pcVar8 = " *Inactive*";
    if (bVar4 != 0) {
      pcVar8 = "";
    }
    bVar11 = TreeNodeEx((char *)in_RSI,(ImGuiTreeNodeFlags)(ulong)bVar11,"%s \'%s\'%s",in_RSI,
                        in_RDI->Name,pcVar8);
    if (bVar4 == 0) {
      PopStyleColor(count);
    }
    bVar5 = IsItemHovered(in_stack_ffffffffffffff60);
    if ((bVar5) && (bVar4 != 0)) {
      GetForegroundDrawList((ImGuiWindow *)0x4ba99a);
      ::operator+(in_stack_ffffffffffffff48,(ImVec2 *)0x4ba9bc);
      ImDrawList::AddRect(unaff_R14,unaff_RBX,(ImVec2 *)in_RDI,(ImU32)((ulong)in_RSI >> 0x20),
                          SUB84(in_RSI,0),(ImDrawFlags)((ulong)label_02 >> 0x20),SUB84(label_02,0));
    }
    if (bVar11) {
      if ((in_RDI->MemoryCompacted & 1U) != 0) {
        TextDisabled("Note: some memory buffers have been compacted/freed.");
      }
      uVar1 = in_RDI->Flags;
      DebugNodeDrawList(in_stack_00000270,in_stack_00000268,in_stack_00000260);
      BulletText((char *)(double)(in_RDI->Pos).x,(double)(in_RDI->Pos).y,(double)(in_RDI->Size).x,
                 (double)(in_RDI->Size).y,(double)(in_RDI->ContentSize).x,
                 (double)(in_RDI->ContentSize).y,(double)(in_RDI->ContentSizeIdeal).x,
                 (double)(in_RDI->ContentSizeIdeal).y,
                 "Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)");
      pcVar8 = "";
      if ((uVar1 & 0x1000000) != 0) {
        pcVar8 = "Child ";
      }
      pcVar6 = "";
      if ((uVar1 & 0x2000000) != 0) {
        pcVar6 = "Tooltip ";
      }
      pcVar7 = "";
      if ((uVar1 & 0x4000000) != 0) {
        pcVar7 = "Popup ";
      }
      pcVar9 = "";
      if ((uVar1 & 0x8000000) != 0) {
        pcVar9 = "Modal ";
      }
      label_01 = "";
      if ((uVar1 & 0x10000000) != 0) {
        label_01 = "ChildMenu ";
      }
      windows = "";
      if ((uVar1 & 0x100) != 0) {
        windows = "NoSavedSettings ";
      }
      pcVar10 = "";
      if ((uVar1 & 0x200) != 0) {
        pcVar10 = "NoMouseInputs";
      }
      columns = "";
      if ((uVar1 & 0x40000) != 0) {
        columns = "NoNavInputs";
      }
      label_00 = "";
      if ((uVar1 & 0x40) != 0) {
        label_00 = "AlwaysAutoResize";
      }
      BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)",(ulong)uVar1,pcVar8,pcVar6,pcVar7,pcVar9,
                 label_01,windows,pcVar10);
      pcVar8 = " \t";
      if ((in_RDI->ScrollbarX & 1U) != 0) {
        pcVar8 = "##X";
      }
      pcVar6 = " \t";
      if ((in_RDI->ScrollbarY & 1U) != 0) {
        pcVar6 = "##Y";
      }
      BulletText((char *)(double)(in_RDI->Scroll).x,(double)(in_RDI->ScrollMax).x,
                 (double)(in_RDI->Scroll).y,(double)(in_RDI->ScrollMax).y,
                 "Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s",pcVar8 + 2,pcVar6 + 2);
      if (((in_RDI->Active & 1U) == 0) && ((in_RDI->WasActive & 1U) == 0)) {
        local_80 = 0xffffffff;
      }
      else {
        local_80 = (uint)in_RDI->BeginOrderWithinContext;
      }
      BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d",
                 (ulong)(in_RDI->Active & 1),(ulong)(in_RDI->WasActive & 1),
                 (ulong)(in_RDI->WriteAccessed & 1),(ulong)local_80);
      BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d",
                 (ulong)(in_RDI->Appearing & 1),(ulong)(in_RDI->Hidden & 1),
                 (ulong)(uint)(int)in_RDI->HiddenFramesCanSkipItems,
                 (ulong)(uint)(int)in_RDI->HiddenFramesCannotSkipItems,
                 (ulong)(in_RDI->SkipItems & 1),label_01,windows,pcVar10);
      for (local_4c = 0; (int)local_4c < 2; local_4c = local_4c + 1) {
        IVar2 = in_RDI->NavRectRel[(int)local_4c].Min;
        IVar3 = in_RDI->NavRectRel[(int)local_4c].Max;
        target_id = IVar2.x;
        fStack_50 = IVar3.y;
        fStack_58 = IVar2.y;
        if ((target_id < fStack_50) || (fStack_58 < fStack_50)) {
          local_54 = IVar3.x;
          BulletText((char *)(double)target_id,(double)fStack_58,(double)local_54,(double)fStack_50,
                     "NavLastIds[%d]: 0x%08X at +(%.1f,%.1f)(%.1f,%.1f)",(ulong)local_4c,
                     (ulong)in_RDI->NavLastIds[(int)local_4c]);
        }
        else {
          BulletText("NavLastIds[%d]: 0x%08X",(ulong)local_4c,
                     (ulong)in_RDI->NavLastIds[(int)local_4c]);
        }
        DebugLocateItemOnHover((ImGuiID)target_id);
      }
      if (in_RDI->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
        storage = (ImGuiStorage *)0x564273;
      }
      else {
        storage = (ImGuiStorage *)in_RDI->NavLastChildNavWindow->Name;
      }
      BulletText("NavLayersActiveMask: %X, NavLastChildNavWindow: %s",
                 (ulong)(uint)(int)(in_RDI->DC).NavLayersActiveMask,storage);
      if (in_RDI->RootWindow != in_RDI) {
        DebugNodeWindow(in_RSI,&label_02->Initialized);
      }
      if (in_RDI->ParentWindow != (ImGuiWindow *)0x0) {
        DebugNodeWindow(in_RSI,&label_02->Initialized);
      }
      if (0 < (in_RDI->DC).ChildWindows.Size) {
        DebugNodeWindowsList((ImVector<ImGuiWindow_*> *)windows,label_01);
      }
      if ((0 < (in_RDI->ColumnsStorage).Size) &&
         (bVar11 = TreeNode("Columns","Columns sets (%d)",(ulong)(uint)(in_RDI->ColumnsStorage).Size
                           ), bVar11)) {
        for (local_60 = 0; local_60 < (in_RDI->ColumnsStorage).Size; local_60 = local_60 + 1) {
          ImVector<ImGuiOldColumns>::operator[](&in_RDI->ColumnsStorage,local_60);
          DebugNodeColumns((ImGuiOldColumns *)columns);
        }
        TreePop();
      }
      DebugNodeStorage(storage,label_00);
      TreePop();
    }
  }
  return;
}

Assistant:

void ImGui::DebugNodeWindow(ImGuiWindow* window, const char* label)
{
    if (window == NULL)
    {
        BulletText("%s: NULL", label);
        return;
    }

    ImGuiContext& g = *GImGui;
    const bool is_active = window->WasActive;
    ImGuiTreeNodeFlags tree_node_flags = (window == g.NavWindow) ? ImGuiTreeNodeFlags_Selected : ImGuiTreeNodeFlags_None;
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    const bool open = TreeNodeEx(label, tree_node_flags, "%s '%s'%s", label, window->Name, is_active ? "" : " *Inactive*");
    if (!is_active) { PopStyleColor(); }
    if (IsItemHovered() && is_active)
        GetForegroundDrawList(window)->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!open)
        return;

    if (window->MemoryCompacted)
        TextDisabled("Note: some memory buffers have been compacted/freed.");

    ImGuiWindowFlags flags = window->Flags;
    DebugNodeDrawList(window, window->DrawList, "DrawList");
    BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y, window->ContentSizeIdeal.x, window->ContentSizeIdeal.y);
    BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
        (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
        (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
        (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
    BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y, window->ScrollbarX ? "X" : "", window->ScrollbarY ? "Y" : "");
    BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
    BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
    for (int layer = 0; layer < ImGuiNavLayer_COUNT; layer++)
    {
        ImRect r = window->NavRectRel[layer];
        if (r.Min.x >= r.Max.y && r.Min.y >= r.Max.y)
            BulletText("NavLastIds[%d]: 0x%08X", layer, window->NavLastIds[layer]);
        else
            BulletText("NavLastIds[%d]: 0x%08X at +(%.1f,%.1f)(%.1f,%.1f)", layer, window->NavLastIds[layer], r.Min.x, r.Min.y, r.Max.x, r.Max.y);
        DebugLocateItemOnHover(window->NavLastIds[layer]);
    }
    BulletText("NavLayersActiveMask: %X, NavLastChildNavWindow: %s", window->DC.NavLayersActiveMask, window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
    if (window->RootWindow != window)       { DebugNodeWindow(window->RootWindow, "RootWindow"); }
    if (window->ParentWindow != NULL)       { DebugNodeWindow(window->ParentWindow, "ParentWindow"); }
    if (window->DC.ChildWindows.Size > 0)   { DebugNodeWindowsList(&window->DC.ChildWindows, "ChildWindows"); }
    if (window->ColumnsStorage.Size > 0 && TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
    {
        for (int n = 0; n < window->ColumnsStorage.Size; n++)
            DebugNodeColumns(&window->ColumnsStorage[n]);
        TreePop();
    }
    DebugNodeStorage(&window->StateStorage, "Storage");
    TreePop();
}